

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOffsets
          (MessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  mapped_type *this_00;
  FileDescriptor *pFVar5;
  OneofDescriptor *pOVar6;
  FieldOptions *this_01;
  string *value2;
  size_type sVar7;
  ulong uVar8;
  reference pvVar9;
  uint *puVar10;
  int i_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  pair<unsigned_long,_unsigned_long> pVar11;
  allocator<char> local_139;
  undefined1 local_138 [8];
  string index;
  int i_2;
  OneofDescriptor *oneof;
  undefined1 local_100 [4];
  int i_1;
  string local_e0;
  FieldDescriptor *local_c0;
  FieldDescriptor *field;
  size_t sStack_b0;
  int i;
  size_t entries;
  size_t offsets;
  int kNumGenericOffsets;
  allocator<char> local_89;
  key_type local_88;
  undefined1 local_68 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  pair<int,_int> local_30;
  Printer *local_28;
  Printer *printer_local;
  MessageGenerator *this_local;
  unsigned_long local_10;
  
  local_28 = printer;
  printer_local = (Printer *)this;
  bVar2 = IsMapEntryMessage(this->descriptor_);
  if (bVar2) {
    variables._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
    variables._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
    local_30 = std::make_pair<int,int>
                         ((int *)((long)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count
                                 + 4),
                          (int *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
              ((pair<unsigned_long,_unsigned_long> *)&this_local,&local_30);
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"classname",&local_89);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_68,&local_88);
    std::__cxx11::string::operator=((string *)this_00,(string *)&this->classname_);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    pFVar5 = Descriptor::file(this->descriptor_);
    bVar2 = HasFieldPresence(pFVar5);
    if (bVar2) {
      io::Printer::Print(local_28,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_68,
                         "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, _has_bits_),\n"
                        );
    }
    else {
      io::Printer::Print(local_28,"~0u,  // no _has_bits_\n");
    }
    io::Printer::Print(local_28,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_68,
                       "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, _internal_metadata_),\n"
                      );
    iVar3 = Descriptor::extension_range_count(this->descriptor_);
    if (iVar3 < 1) {
      io::Printer::Print(local_28,"~0u,  // no _extensions_\n");
    }
    else {
      io::Printer::Print(local_28,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_68,
                         "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, _extensions_),\n"
                        );
    }
    iVar3 = Descriptor::oneof_decl_count(this->descriptor_);
    if (iVar3 < 1) {
      io::Printer::Print(local_28,"~0u,  // no _oneof_case_\n");
    }
    else {
      io::Printer::Print(local_28,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_68,
                         "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, _oneof_case_[0]),\n"
                        );
    }
    if (this->num_weak_fields_ < 1) {
      io::Printer::Print(local_28,"~0u,  // no _weak_field_map_\n");
    }
    else {
      io::Printer::Print(local_28,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_68,
                         "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, _weak_field_map_),\n"
                        );
    }
    offsets._0_4_ = 5;
    iVar3 = Descriptor::field_count(this->descriptor_);
    iVar4 = Descriptor::oneof_decl_count(this->descriptor_);
    sStack_b0 = (size_t)(iVar3 + 5 + iVar4);
    entries = sStack_b0;
    for (field._4_4_ = 0; iVar3 = field._4_4_, iVar4 = Descriptor::field_count(this->descriptor_),
        iVar3 < iVar4; field._4_4_ = field._4_4_ + 1) {
      local_c0 = Descriptor::field(this->descriptor_,field._4_4_);
      pOVar6 = FieldDescriptor::containing_oneof(local_c0);
      field_01 = extraout_RDX;
      if (pOVar6 == (OneofDescriptor *)0x0) {
        this_01 = FieldDescriptor::options(local_c0);
        bVar2 = FieldOptions::weak(this_01);
        pPVar1 = local_28;
        field_01 = field_00;
        if (bVar2) goto LAB_003f9290;
        FieldName_abi_cxx11_((string *)local_100,(cpp *)local_c0,field_00);
        io::Printer::Print(pPVar1,
                           "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, $name$_),\n"
                           ,"classname",&this->classname_,"name",(string *)local_100);
        std::__cxx11::string::~string((string *)local_100);
      }
      else {
LAB_003f9290:
        pPVar1 = local_28;
        FieldName_abi_cxx11_(&local_e0,(cpp *)local_c0,field_01);
        io::Printer::Print(pPVar1,
                           "GOOGLE_PROTOBUF_GENERATED_DEFAULT_ONEOF_FIELD_OFFSET((&_$classname$_default_instance_), $name$_),\n"
                           ,"classname",&this->classname_,"name",&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
      }
    }
    for (oneof._4_4_ = 0; iVar3 = Descriptor::oneof_decl_count(this->descriptor_),
        oneof._4_4_ < iVar3; oneof._4_4_ = oneof._4_4_ + 1) {
      pOVar6 = Descriptor::oneof_decl(this->descriptor_,oneof._4_4_);
      pPVar1 = local_28;
      value2 = OneofDescriptor::name_abi_cxx11_(pOVar6);
      io::Printer::Print(pPVar1,
                         "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, $name$_),\n",
                         "classname",&this->classname_,"name",value2);
    }
    pFVar5 = Descriptor::file(this->descriptor_);
    bVar2 = HasFieldPresence(pFVar5);
    if (bVar2) {
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->has_bit_indices_);
      sStack_b0 = sVar7 + sStack_b0;
      for (index.field_2._12_4_ = 0; uVar8 = (ulong)(int)index.field_2._12_4_,
          sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->has_bit_indices_),
          uVar8 < sVar7; index.field_2._12_4_ = index.field_2._12_4_ + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->has_bit_indices_,(long)(int)index.field_2._12_4_);
        if (*pvVar9 < 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)local_138,"~0u",&local_139);
          std::allocator<char>::~allocator(&local_139);
        }
        else {
          puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                      (&this->has_bit_indices_,(long)(int)index.field_2._12_4_);
          SimpleItoa_abi_cxx11_((string *)local_138,(protobuf *)(ulong)*puVar10,i_00);
        }
        io::Printer::Print(local_28,"$index$,\n","index",(string *)local_138);
        std::__cxx11::string::~string((string *)local_138);
      }
    }
    pVar11 = std::make_pair<unsigned_long&,unsigned_long_const&>(&stack0xffffffffffffff50,&entries);
    local_10 = pVar11.second;
    this_local = (MessageGenerator *)pVar11.first;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_68);
  }
  pVar11.second = local_10;
  pVar11.first = (unsigned_long)this_local;
  return pVar11;
}

Assistant:

std::pair<size_t, size_t> MessageGenerator::GenerateOffsets(
    io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) return std::make_pair(0, 0);
  std::map<string, string> variables;
  variables["classname"] = classname_;

  if (HasFieldPresence(descriptor_->file())) {
    printer->Print(
        variables,
        "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, "
        "_has_bits_),\n");
  } else {
    printer->Print("~0u,  // no _has_bits_\n");
  }
  printer->Print(variables,
                 "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, "
                 "_internal_metadata_),\n");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, "
        "_extensions_),\n");
  } else {
    printer->Print("~0u,  // no _extensions_\n");
  }
  if (descriptor_->oneof_decl_count() > 0) {
    printer->Print(variables,
                   "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET("
                   "$classname$, _oneof_case_[0]),\n");
  } else {
    printer->Print("~0u,  // no _oneof_case_\n");
  }
  if (num_weak_fields_ > 0) {
    printer->Print(variables,
                   "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$,"
                   " _weak_field_map_),\n");
  } else {
    printer->Print("~0u,  // no _weak_field_map_\n");
  }
  const int kNumGenericOffsets = 5;  // the number of fixed offsets above
  const size_t offsets = kNumGenericOffsets +
                         descriptor_->field_count() +
                         descriptor_->oneof_decl_count();
  size_t entries = offsets;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof() || field->options().weak()) {
      printer->Print(
          "GOOGLE_PROTOBUF_GENERATED_DEFAULT_ONEOF_FIELD_OFFSET("
          "(&_$classname$_default_instance_), $name$_),\n",
          "classname", classname_, "name", FieldName(field));
    } else {
      printer->Print(
          "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, "
                                                         "$name$_),\n",
          "classname", classname_,
          "name", FieldName(field));
    }
  }

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    printer->Print(
      "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, $name$_),\n",
      "classname", classname_,
      "name", oneof->name());
  }

  if (HasFieldPresence(descriptor_->file())) {
    entries += has_bit_indices_.size();
    for (int i = 0; i < has_bit_indices_.size(); i++) {
      const string index = has_bit_indices_[i] >= 0 ?
        SimpleItoa(has_bit_indices_[i]) : "~0u";
      printer->Print("$index$,\n", "index", index);
    }
  }

  return std::make_pair(entries, offsets);
}